

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lib_table.c
# Opt level: O1

int lj_cf_table_concat(lua_State *L)

{
  uint uVar1;
  uint uVar2;
  TValue *pTVar3;
  uint n;
  MSize MVar4;
  GCstr *pGVar5;
  ulong uVar6;
  luaL_Buffer b;
  luaL_Buffer local_2048;
  
  pTVar3 = L->base;
  if ((pTVar3 < L->top) && ((pTVar3->field_2).it == 0xfffffff4)) {
    uVar1 = (pTVar3->u32).lo;
    uVar2 = 0;
    if ((pTVar3 + 1 < L->top) && (*(int *)((long)pTVar3 + 0xc) != -1)) {
      pGVar5 = lj_lib_checkstr(L,2);
    }
    else {
      pGVar5 = (GCstr *)0x0;
    }
    if (pGVar5 != (GCstr *)0x0) {
      uVar2 = pGVar5->len;
    }
    n = 1;
    if ((L->base + 2 < L->top) && (*(int *)((long)L->base + 0x14) != -1)) {
      n = lj_lib_checkint(L,3);
    }
    if ((L->base + 3 < L->top) && (*(int *)((long)L->base + 0x1c) != -1)) {
      MVar4 = lj_lib_checkint(L,4);
    }
    else {
      MVar4 = lj_tab_len((GCtab *)(ulong)uVar1);
    }
    local_2048.p = local_2048.buffer;
    local_2048.lvl = 0;
    local_2048.L = L;
    if ((int)n <= (int)MVar4) {
      do {
        lua_rawgeti(L,1,n);
        uVar1 = *(uint *)((long)L->top + -4);
        if (0xfffeffff < uVar1 && uVar1 != 0xfffffffb) {
          uVar6 = 3;
          if ((uVar1 & 0xffff8000) != 0xffff0000) {
            uVar6 = (ulong)~uVar1;
          }
          lj_err_callerv(L,LJ_ERR_TABCAT,lj_obj_itypename[uVar6],(ulong)n);
        }
        luaL_addvalue(&local_2048);
        if ((MVar4 != n) && (uVar2 != 0)) {
          luaL_addlstring(&local_2048,(char *)(pGVar5 + 1),(ulong)uVar2);
        }
        n = n + 1;
      } while (MVar4 + 1 != n);
    }
    emptybuffer(&local_2048);
    lua_concat(local_2048.L,local_2048.lvl);
    return 1;
  }
  lj_err_argt(L,1,5);
}

Assistant:

LJLIB_CF(table_concat)
{
  luaL_Buffer b;
  GCtab *t = lj_lib_checktab(L, 1);
  GCstr *sep = lj_lib_optstr(L, 2);
  MSize seplen = sep ? sep->len : 0;
  int32_t i = lj_lib_optint(L, 3, 1);
  int32_t e = (L->base+3 < L->top && !tvisnil(L->base+3)) ?
	      lj_lib_checkint(L, 4) : (int32_t)lj_tab_len(t);
  luaL_buffinit(L, &b);
  if (i <= e) {
    for (;;) {
      cTValue *o;
      lua_rawgeti(L, 1, i);
      o = L->top-1;
      if (!(tvisstr(o) || tvisnumber(o)))
	lj_err_callerv(L, LJ_ERR_TABCAT, lj_typename(o), i);
      luaL_addvalue(&b);
      if (i++ == e) break;
      if (seplen)
	luaL_addlstring(&b, strdata(sep), seplen);
    }
  }
  luaL_pushresult(&b);
  return 1;
}